

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall Board::setFrame(Board *this)

{
  int i;
  long lVar1;
  
  *(undefined8 *)(this->rows + 0x15) = 0x1fffff00000000;
  this->rows[0] = 0xfff;
  this->cols[0xb] = 0x1fffff;
  for (lVar1 = 1; lVar1 != 0x15; lVar1 = lVar1 + 1) {
    this->rows[lVar1] = 0x801;
  }
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    this->cols[lVar1 + 1] = 1;
  }
  return;
}

Assistant:

void Board::setFrame(){
    rows[MAPHEIGHT + 1] = 0;
    rows[0] = FULL_ROW;
    cols[0] = cols[MAPWIDTH + 1] = FULL_COL;
    for (int i = 1; i <= MAPHEIGHT; ++i)
        rows[i] = EMPTY_ROW;
    for (int i = 1; i <= MAPWIDTH; ++i)
        cols[i] = EMPTY_COL;
}